

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeKRMmatricesGlobal
          (ChElementHexaANCF_3813 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double Mfactor_local;
  double kr_factor;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
  local_108;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
  local_e0;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
  local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>
  local_80;
  
  Mfactor_local = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0x18) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0x18)) {
    ComputeStiffnessMatrix(this);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = Kfactor;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = Rfactor;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((this->m_Material).
                    super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->damping_K;
    auVar1 = vfmadd231sd_fma(auVar2,auVar3,auVar1);
    kr_factor = auVar1._0_8_;
    Eigen::operator*(&local_e0,&kr_factor,(StorageBaseType *)&this->m_StiffnessMatrix);
    Eigen::operator*(&local_108,&Mfactor_local,(StorageBaseType *)&this->m_MassMatrix);
    local_80.m_lhs.m_lhs.m_functor.m_other = local_e0.m_lhs.m_functor.m_other;
    local_80.m_lhs.m_rhs = local_e0.m_rhs;
    local_80.m_rhs.m_lhs.m_functor.m_other = local_108.m_lhs.m_functor.m_other;
    local_80.m_rhs.m_rhs = local_108.m_rhs;
    Eigen::
    Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
    ::Block(&local_b8,H,0,0,0x18,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,24,1,24,24>const>const,Eigen::Matrix<double,24,24,1,24,24>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,24,1,24,24>const>const,Eigen::Matrix<double,24,24,1,24,24>const>const>>
              (&local_b8,&local_80);
    return;
  }
  __assert_fail("(H.rows() == 24) && (H.cols() == 24)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3813.cpp"
                ,0x66d,
                "virtual void chrono::fea::ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 24) && (H.cols() == 24));

    // Compute global stiffness matrix:
    ComputeStiffnessMatrix();

    // For K stiffness matrix and R matrix: scale by factors
    // because [R] = r*[K] , so kf*[K]+rf*[R] = (kf+rf*r)*[K]
    double kr_factor = Kfactor + Rfactor * m_Material->Get_RayleighDampingK();

    // Paste scaled K stiffness matrix and R matrix in resulting H and add scaled mass matrix.
    H.block(0, 0, 24, 24) = kr_factor * m_StiffnessMatrix + Mfactor * m_MassMatrix;
}